

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableWidget::dropEvent(QTableWidget *this,QDropEvent *event)

{
  bool bVar1;
  DropAction DVar2;
  DragDropMode DVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QTableWidgetPrivate *pQVar8;
  QTableWidget *pQVar9;
  ulong uVar10;
  int *piVar11;
  const_iterator cVar12;
  QModelIndex *pQVar13;
  value_type __addr_len;
  sockaddr *__addr;
  QDropEvent *in_RSI;
  QTableWidget *in_RDI;
  long in_FS_OFFSET;
  int c;
  int r;
  QModelIndex *index_2;
  QModelIndexList *__range3_2;
  QModelIndex *index_1;
  QModelIndexList *__range3_1;
  int indexesCount;
  QModelIndex *index;
  QModelIndexList *__range3;
  QTableWidgetPrivate *d;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  QList<QTableWidgetItem_*> taken;
  const_iterator __end3;
  const_iterator __begin3;
  int left;
  int top;
  QModelIndexList indexes;
  int row;
  int col;
  QModelIndex topIndex;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  QList<QTableWidgetItem_*> *in_stack_ffffffffffffff08;
  QTableWidget *asize;
  const_iterator in_stack_ffffffffffffff58;
  const_iterator in_stack_ffffffffffffff60;
  const_iterator local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  int local_68;
  int local_64;
  QModelIndex *local_60;
  const_iterator local_58;
  const_iterator local_50;
  int local_48;
  int local_44;
  QList<QModelIndex> local_40;
  int local_28;
  undefined1 local_24 [12];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  asize = in_RDI;
  pQVar8 = d_func((QTableWidget *)0x8dcc35);
  pQVar9 = (QTableWidget *)QDropEvent::source();
  if ((pQVar9 == in_RDI) &&
     ((DVar2 = QDropEvent::dropAction(in_RSI), DVar2 == MoveAction ||
      (DVar3 = QAbstractItemView::dragDropMode
                         ((QAbstractItemView *)
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
      DVar3 == InternalMove)))) {
    local_24._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x8dccae);
    local_24._0_4_ = -1;
    local_28 = -1;
    bVar1 = QEvent::isAccepted((QEvent *)in_RSI);
    if (!bVar1) {
      __addr_len = (value_type)local_24;
      uVar10 = (**(code **)(*(long *)&(pQVar8->super_QTableViewPrivate).
                                      super_QAbstractItemViewPrivate.
                                      super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                      super_QWidgetPrivate + 0x110))
                         (pQVar8,in_RSI,&local_28,__addr_len,local_24 + 4);
      if ((((uVar10 & 1) != 0) && (local_28 == -1)) && (local_24._0_4_ == -1)) {
        local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_40.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        (**(code **)(*(long *)&(in_RDI->super_QTableView).super_QAbstractItemView.
                               super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x2d8))
                  (&local_40);
        local_44 = 0x7fffffff;
        local_48 = 0x7fffffff;
        local_50.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        local_50 = QList<QModelIndex>::begin
                             ((QList<QModelIndex> *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        local_58.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = QList<QModelIndex>::end
                             ((QList<QModelIndex> *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        while( true ) {
          local_60 = local_58.i;
          bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_50,local_58);
          if (!bVar1) break;
          pQVar13 = QList<QModelIndex>::const_iterator::operator*(&local_50);
          local_64 = QModelIndex::row(pQVar13);
          piVar11 = qMin<int>(&local_64,&local_44);
          local_44 = *piVar11;
          local_68 = QModelIndex::column(pQVar13);
          piVar11 = qMin<int>(&local_68,&local_48);
          local_48 = *piVar11;
          QList<QModelIndex>::const_iterator::operator++(&local_50);
        }
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        local_70 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QTableWidgetItem_*>::QList((QList<QTableWidgetItem_*> *)0x8dced6);
        QList<QModelIndex>::size(&local_40);
        QList<QTableWidgetItem_*>::reserve(in_stack_ffffffffffffff08,(qsizetype)asize);
        local_88.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        local_88 = QList<QModelIndex>::begin
                             ((QList<QModelIndex> *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        cVar12 = QList<QModelIndex>::end
                           ((QList<QModelIndex> *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        while (bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_88,cVar12), bVar1) {
          pQVar13 = QList<QModelIndex>::const_iterator::operator*(&local_88);
          in_stack_fffffffffffffeec = QModelIndex::row(pQVar13);
          QModelIndex::column(pQVar13);
          takeItem(in_RDI,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
          QList<QTableWidgetItem_*>::append
                    ((QList<QTableWidgetItem_*> *)0x8dcfdb,
                     (parameter_type)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          QList<QModelIndex>::const_iterator::operator++(&local_88);
        }
        in_stack_ffffffffffffff60 =
             QList<QModelIndex>::begin
                       ((QList<QModelIndex> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        cVar12 = QList<QModelIndex>::end
                           ((QList<QModelIndex> *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        while (in_stack_ffffffffffffff58.i = cVar12.i,
              bVar1 = QList<QModelIndex>::const_iterator::operator!=
                                ((const_iterator *)&stack0xffffffffffffff60,cVar12), bVar1) {
          pQVar13 = QList<QModelIndex>::const_iterator::operator*
                              ((const_iterator *)&stack0xffffffffffffff60);
          iVar4 = QModelIndex::row(pQVar13);
          iVar4 = iVar4 - local_44;
          iVar5 = QModelIndex::row((QModelIndex *)(local_24 + 4));
          iVar4 = iVar4 + iVar5;
          iVar6 = QModelIndex::column(pQVar13);
          iVar6 = iVar6 - local_48;
          iVar7 = QModelIndex::column((QModelIndex *)(local_24 + 4));
          iVar7 = iVar6 + iVar7;
          iVar5 = iVar7;
          __addr_len = QList<QTableWidgetItem_*>::takeFirst
                                 ((QList<QTableWidgetItem_*> *)CONCAT44(iVar4,iVar6));
          setItem((QTableWidget *)CONCAT44(iVar4,iVar5),(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                  (QTableWidgetItem *)CONCAT44(in_stack_fffffffffffffeec,iVar7));
          QList<QModelIndex>::const_iterator::operator++((const_iterator *)&stack0xffffffffffffff60)
          ;
          cVar12.i = in_stack_ffffffffffffff58.i;
        }
        QEvent::accept((QEvent *)in_RSI,(int)cVar12.i,__addr,(socklen_t *)__addr_len);
        QList<QTableWidgetItem_*>::~QList((QList<QTableWidgetItem_*> *)0x8dd14b);
        QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8dd158);
      }
    }
    bVar1 = QEvent::isAccepted((QEvent *)in_RSI);
    if (bVar1) {
      (pQVar8->super_QTableViewPrivate).super_QAbstractItemViewPrivate.dropEventMoved = true;
    }
  }
  QTableView::dropEvent
            ((QTableView *)in_stack_ffffffffffffff60.i,(QDropEvent *)in_stack_ffffffffffffff58.i);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableWidget::dropEvent(QDropEvent *event) {
    Q_D(QTableWidget);
    if (event->source() == this && (event->dropAction() == Qt::MoveAction ||
                                    dragDropMode() == QAbstractItemView::InternalMove)) {
        QModelIndex topIndex;
        int col = -1;
        int row = -1;
        // check whether a subclass has already accepted the event, ie. moved the data
        if (!event->isAccepted() && d->dropOn(event, &row, &col, &topIndex) && row == -1 && col == -1) {
            // Drop onto item
            const QModelIndexList indexes = selectedIndexes();
            int top = INT_MAX;
            int left = INT_MAX;
            for (const auto &index : indexes) {
                top = qMin(index.row(), top);
                left = qMin(index.column(), left);
            }
            QList<QTableWidgetItem *> taken;
            const int indexesCount = indexes.size();
            taken.reserve(indexesCount);
            for (const auto &index : indexes)
                taken.append(takeItem(index.row(), index.column()));

            for (const auto &index : indexes) {
                int r = index.row() - top + topIndex.row();
                int c = index.column() - left + topIndex.column();
                setItem(r, c, taken.takeFirst());
            }

            event->accept();
        }
        // either we or a subclass accepted the drop event, so assume that the data was
        // moved and that QAbstractItemView shouldn't remove the source when QDrag::exec returns
        if (event->isAccepted())
            d->dropEventMoved = true;
    }

    QTableView::dropEvent(event);
}